

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QInputDialog::setOptions(QInputDialog *this,InputDialogOptions options)

{
  QFlagsStorageHelper<QInputDialog::InputDialogOption,_4> QVar1;
  QInputDialogPrivate *this_00;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  this_00 = *(QInputDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QVar1.super_QFlagsStorage<QInputDialog::InputDialogOption>.i =
       (QFlagsStorage<QInputDialog::InputDialogOption>)
       (this_00->opts).super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
       super_QFlagsStorage<QInputDialog::InputDialogOption>.i;
  if (QVar1.super_QFlagsStorage<QInputDialog::InputDialogOption>.i !=
      (QFlagsStorage<QInputDialog::InputDialogOption>)
      options.super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
      super_QFlagsStorage<QInputDialog::InputDialogOption>.i) {
    uVar4 = (uint)QVar1.super_QFlagsStorage<QInputDialog::InputDialogOption>.i ^
            (uint)options.super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
                  super_QFlagsStorage<QInputDialog::InputDialogOption>.i;
    (this_00->opts).super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
    super_QFlagsStorage<QInputDialog::InputDialogOption>.i =
         (Int)options.super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
              super_QFlagsStorage<QInputDialog::InputDialogOption>.i;
    QInputDialogPrivate::ensureLayout(this_00);
    if ((uVar4 & 1) != 0) {
      (**(code **)(*(long *)&this_00->buttonBox->super_QWidget + 0x68))
                (this_00->buttonBox,
                 ((uint)options.super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
                        super_QFlagsStorage<QInputDialog::InputDialogOption>.i & 1) == 0);
    }
    if ((uVar4 & 2) != 0) {
      lVar2 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
      lVar3 = *(long *)(lVar2 + 800);
      if ((lVar3 == 0) ||
         ((lVar3 != *(long *)(lVar2 + 0x300) && (lVar3 != *(long *)(lVar2 + 0x308))))) {
        QInputDialogPrivate::chooseRightTextInputWidget(this_00);
      }
    }
    if ((uVar4 & 4) != 0) {
      lVar2 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
      lVar3 = *(long *)(lVar2 + 800);
      if ((lVar3 == 0) ||
         ((lVar3 != *(long *)(lVar2 + 0x300) && (lVar3 != *(long *)(lVar2 + 0x308))))) {
        QInputDialogPrivate::chooseRightTextInputWidget(this_00);
        return;
      }
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }